

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

DWORD GetCurrentDirectoryA(DWORD nBufferLength,LPSTR lpBuffer)

{
  DWORD dwErrCode;
  char *__s;
  size_t sVar1;
  DWORD DVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    __s = PAL__getcwd((char *)0x0,0x401);
    if (__s == (char *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00327a20;
      dwErrCode = DIRGetLastErrorFromErrno();
      DVar2 = 0;
      PAL_free((void *)0x0);
      if (dwErrCode != 0) {
        SetLastError(dwErrCode);
      }
    }
    else {
      sVar1 = strlen(__s);
      DVar2 = (DWORD)sVar1;
      if (DVar2 < nBufferLength) {
        strcpy_s(lpBuffer,(ulong)nBufferLength,__s);
      }
      else {
        DVar2 = DVar2 + 1;
      }
      PAL_free(__s);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return DVar2;
    }
  }
LAB_00327a20:
  abort();
}

Assistant:

DWORD
PALAPI
GetCurrentDirectoryA(
             IN DWORD nBufferLength,
             OUT LPSTR lpBuffer)
{
    DWORD dwDirLen = 0;
    DWORD dwLastError = 0;

    char  *current_dir;

    PERF_ENTRY(GetCurrentDirectoryA);
    ENTRY("GetCurrentDirectoryA(nBufferLength=%u, lpBuffer=%p)\n", nBufferLength, lpBuffer);

    /* NULL first arg means getcwd will allocate the string */
    current_dir = PAL__getcwd( NULL, MAX_LONGPATH + 1 );

    if ( !current_dir )
    {
        WARN( "PAL__getcwd returned NULL\n" );
        dwLastError = DIRGetLastErrorFromErrno();
        goto done;
    }

    dwDirLen = strlen( current_dir );

    /* if the supplied buffer isn't long enough, return the required
       length, including room for the NULL terminator */
    if ( nBufferLength <= dwDirLen )
    {
        ++dwDirLen; /* include space for the NULL */
        goto done;
    }
    else
    {
        strcpy_s( lpBuffer, nBufferLength, current_dir );
    }

done:
    PAL_free( current_dir );

    if ( dwLastError )
    {
        SetLastError(dwLastError);
    }

    LOGEXIT("GetCurrentDirectoryA returns DWORD %u\n", dwDirLen);
    PERF_EXIT(GetCurrentDirectoryA);
    return dwDirLen;
}